

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::Print
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,ostream *out)

{
  int iVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  int iVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  TPZNodeRep<2,_pztopology::TPZLine>::Print((TPZNodeRep<2,_pztopology::TPZLine> *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"Neighbours/transformations used for mapping the sides :\n",0x38);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Side: ",6);
  poVar2 = (ostream *)std::ostream::operator<<(out,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," El/side: ",10);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  iVar1 = this->fNeighbours[0].fSide;
  iVar3 = -1;
  if (this->fNeighbours[0].fGeoElIndex != -1) {
    iVar3 = iVar1;
  }
  if (iVar1 == -1) {
    iVar3 = iVar1;
  }
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Print(std::ostream &out) const
{
	TGeo::Print(out);
	out << "Neighbours/transformations used for mapping the sides :\n";
	int is;
	for(is=TGeo::NNodes; is<TGeo::NSides; is++)
	{
        out << "Side: " << is << " El/side: " << fNeighbours[is-TGeo::NNodes].ElementIndex() << ":" <<
        fNeighbours[is-TGeo::NNodes].Side() << '\n';
	}
}